

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O1

void __thiscall
trng::int_math::power<2147461007,_889744251>::power(power<2147461007,_889744251> *this)

{
  uint32_t extraout_EAX;
  uint32_t extraout_EAX_00;
  int32_t i;
  long lVar1;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  lVar1 = 0;
  do {
    in_XMM0_Qa = pow(this,in_XMM0_Qa,in_XMM1_Qa);
    this->b_power0[lVar1] = extraout_EAX;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10000);
  lVar1 = 0x10000;
  do {
    in_XMM0_Qa = pow(this,in_XMM0_Qa,in_XMM1_Qa);
    this->b_power0[lVar1] = extraout_EAX_00;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x18000);
  return;
}

Assistant:

power() {
        for (int32_t i{0}; i < 0x10000; ++i)
          b_power0[i] = pow(i);
        for (int32_t i{0}; i < 0x08000; ++i)
          b_power1[i] = pow(i * 0x10000);
      }